

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  int iVar2;
  sqlite3_str *p;
  sqlite3 *psVar3;
  uchar *z;
  int firstTerm;
  sqlite3 *db;
  int nSep;
  int nVal;
  char *zSep;
  StrAccum *pAccum;
  char *zVal;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar2 = sqlite3_value_type(*argv);
  if ((iVar2 != 5) &&
     (p = (sqlite3_str *)sqlite3_aggregate_context(context,0x20), p != (sqlite3_str *)0x0)) {
    psVar3 = sqlite3_context_db_handle(context);
    uVar1 = p->mxAlloc;
    p->mxAlloc = psVar3->aLimit[0];
    if (uVar1 != 0) {
      if (argc == 2) {
        _nSep = (char *)sqlite3_value_text(argv[1]);
        db._0_4_ = sqlite3_value_bytes(argv[1]);
      }
      else {
        _nSep = ",";
        db._0_4_ = 1;
      }
      if ((uchar *)_nSep != (uchar *)0x0) {
        sqlite3_str_append(p,_nSep,(int)db);
      }
    }
    z = sqlite3_value_text(*argv);
    iVar2 = sqlite3_value_bytes(*argv);
    if (z != (uchar *)0x0) {
      sqlite3_str_append(p,(char *)z,iVar2);
    }
  }
  return;
}

Assistant:

static void groupConcatStep(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zVal;
  StrAccum *pAccum;
  const char *zSep;
  int nVal, nSep;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pAccum = (StrAccum*)sqlite3_aggregate_context(context, sizeof(*pAccum));

  if( pAccum ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    int firstTerm = pAccum->mxAlloc==0;
    pAccum->mxAlloc = db->aLimit[SQLITE_LIMIT_LENGTH];
    if( !firstTerm ){
      if( argc==2 ){
        zSep = (char*)sqlite3_value_text(argv[1]);
        nSep = sqlite3_value_bytes(argv[1]);
      }else{
        zSep = ",";
        nSep = 1;
      }
      if( zSep ) sqlite3_str_append(pAccum, zSep, nSep);
    }
    zVal = (char*)sqlite3_value_text(argv[0]);
    nVal = sqlite3_value_bytes(argv[0]);
    if( zVal ) sqlite3_str_append(pAccum, zVal, nVal);
  }
}